

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O1

wchar_t lookup_feat(char *name)

{
  int iVar1;
  ulong unaff_RBP;
  feature *pfVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0;
  pfVar2 = f_info;
  while( true ) {
    if (pfVar2->name == (char *)0x0) {
      bVar4 = false;
    }
    else {
      iVar1 = strcmp(name,pfVar2->name);
      bVar4 = iVar1 == 0;
      if (bVar4) {
        unaff_RBP = uVar3;
      }
      unaff_RBP = unaff_RBP & 0xffffffff;
    }
    if (bVar4) break;
    uVar3 = uVar3 + 1;
    pfVar2 = pfVar2 + 1;
    if (uVar3 == 0x19) {
      quit_fmt("Failed to find terrain feature %s",name);
      return L'\xffffffff';
    }
  }
  return (wchar_t)unaff_RBP;
}

Assistant:

int lookup_feat(const char *name)
{
	int i;

	/* Look for it */
	for (i = 0; i < FEAT_MAX; i++) {
		struct feature *feat = &f_info[i];
		if (!feat->name)
			continue;

		/* Test for equality */
		if (streq(name, feat->name))
			return i;
	}

	/* Fail horribly */
	quit_fmt("Failed to find terrain feature %s", name);
	return -1;
}